

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::useUniform
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,BaseUniformType type)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  MessageBuilder local_430;
  Vector<float,_4> local_2ac;
  Vector<float,_4> local_29c;
  Vector<float,_4> local_28c;
  Vector<float,_4> local_27c;
  Vector<float,_4> local_26c;
  Vector<float,_4> local_25c;
  Vector<float,_4> local_24c;
  Vector<float,_4> local_23c;
  Vector<float,_4> local_22c;
  Vector<float,_3> local_21c;
  Vector<float,_3> local_210;
  Vector<float,_3> local_204;
  Vector<float,_3> local_1f8;
  Vector<float,_3> local_1ec;
  Vector<float,_3> local_1e0;
  Vector<float,_2> local_1d4;
  Vector<float,_2> local_1cc;
  Vector<float,_2> local_1c4;
  Vector<float,_2> local_1bc;
  Vector<float,_2> local_1b4;
  Vector<float,_2> local_1ac;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  Vector<int,_4> local_164;
  Vector<int,_4> local_154;
  Vector<int,_4> local_144;
  Vector<int,_4> local_134;
  Vector<int,_4> local_124;
  Vector<int,_4> local_114;
  Vector<int,_4> local_104;
  Vector<int,_3> local_f4;
  Vector<int,_3> local_e8;
  Vector<int,_3> local_dc;
  Vector<int,_3> local_d0;
  Vector<int,_3> local_c4;
  Vector<int,_3> local_b8;
  Vector<int,_3> local_ac;
  Vector<int,_2> local_a0;
  Vector<int,_2> local_98;
  Vector<int,_2> local_90;
  Vector<int,_2> local_88;
  Vector<int,_2> local_80;
  Vector<int,_2> local_78;
  Vector<int,_2> local_70;
  int local_68 [10];
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  int local_20 [3];
  deUint32 local_14;
  BaseUniformType type_local;
  deUint32 bindingLocation_local;
  ShaderRenderCaseInstance *this_local;
  
  local_20[2] = type;
  local_14 = bindingLocation;
  _type_local = this;
  switch(type) {
  case UB_FALSE:
    local_20[1] = 0;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_20 + 1);
    break;
  case UB_TRUE:
    local_20[0] = 1;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_20);
    break;
  case UB4_FALSE:
    tcu::Vector<float,_4>::Vector(&local_30,0.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_30);
    break;
  case UB4_TRUE:
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_40);
    break;
  case UI_ZERO:
    local_68[9] = 0;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 9);
    break;
  case UI_ONE:
    local_68[8] = 1;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 8);
    break;
  case UI_TWO:
    local_68[7] = 2;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 7);
    break;
  case UI_THREE:
    local_68[6] = 3;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 6);
    break;
  case UI_FOUR:
    local_68[5] = 4;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 5);
    break;
  case UI_FIVE:
    local_68[4] = 5;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 4);
    break;
  case UI_SIX:
    local_68[3] = 6;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 3);
    break;
  case UI_SEVEN:
    local_68[2] = 7;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 2);
    break;
  case UI_EIGHT:
    local_68[1] = 8;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68 + 1);
    break;
  case UI_ONEHUNDREDONE:
    local_68[0] = 0x65;
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_68);
    break;
  case UI2_MINUS_ONE:
    tcu::Vector<int,_2>::Vector(&local_70,-1);
    addUniform<tcu::Vector<int,2>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_70)
    ;
    break;
  case UI2_ZERO:
    tcu::Vector<int,_2>::Vector(&local_78,0);
    addUniform<tcu::Vector<int,2>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_78)
    ;
    break;
  case UI2_ONE:
    tcu::Vector<int,_2>::Vector(&local_80,1);
    addUniform<tcu::Vector<int,2>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_80)
    ;
    break;
  case UI2_TWO:
    tcu::Vector<int,_2>::Vector(&local_88,2);
    addUniform<tcu::Vector<int,2>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_88)
    ;
    break;
  case UI2_THREE:
    tcu::Vector<int,_2>::Vector(&local_90,3);
    addUniform<tcu::Vector<int,2>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_90)
    ;
    break;
  case UI2_FOUR:
    tcu::Vector<int,_2>::Vector(&local_98,4);
    addUniform<tcu::Vector<int,2>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_98)
    ;
    break;
  case UI2_FIVE:
    tcu::Vector<int,_2>::Vector(&local_a0,5);
    addUniform<tcu::Vector<int,2>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_a0)
    ;
    break;
  case UI3_MINUS_ONE:
    tcu::Vector<int,_3>::Vector(&local_ac,-1);
    addUniform<tcu::Vector<int,3>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_ac)
    ;
    break;
  case UI3_ZERO:
    tcu::Vector<int,_3>::Vector(&local_b8,0);
    addUniform<tcu::Vector<int,3>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_b8)
    ;
    break;
  case UI3_ONE:
    tcu::Vector<int,_3>::Vector(&local_c4,1);
    addUniform<tcu::Vector<int,3>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_c4)
    ;
    break;
  case UI3_TWO:
    tcu::Vector<int,_3>::Vector(&local_d0,2);
    addUniform<tcu::Vector<int,3>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_d0)
    ;
    break;
  case UI3_THREE:
    tcu::Vector<int,_3>::Vector(&local_dc,3);
    addUniform<tcu::Vector<int,3>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_dc)
    ;
    break;
  case UI3_FOUR:
    tcu::Vector<int,_3>::Vector(&local_e8,4);
    addUniform<tcu::Vector<int,3>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_e8)
    ;
    break;
  case UI3_FIVE:
    tcu::Vector<int,_3>::Vector(&local_f4,5);
    addUniform<tcu::Vector<int,3>>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_f4)
    ;
    break;
  case UI4_MINUS_ONE:
    tcu::Vector<int,_4>::Vector(&local_104,-1);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_104);
    break;
  case UI4_ZERO:
    tcu::Vector<int,_4>::Vector(&local_114,0);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_114);
    break;
  case UI4_ONE:
    tcu::Vector<int,_4>::Vector(&local_124,1);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_124);
    break;
  case UI4_TWO:
    tcu::Vector<int,_4>::Vector(&local_134,2);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_134);
    break;
  case UI4_THREE:
    tcu::Vector<int,_4>::Vector(&local_144,3);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_144);
    break;
  case UI4_FOUR:
    tcu::Vector<int,_4>::Vector(&local_154,4);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_154);
    break;
  case UI4_FIVE:
    tcu::Vector<int,_4>::Vector(&local_164,5);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_164);
    break;
  case UF_ZERO:
    local_168 = 0.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_168);
    break;
  case UF_ONE:
    local_16c = 1.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_16c);
    break;
  case UF_TWO:
    local_170 = 2.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_170);
    break;
  case UF_THREE:
    local_174 = 3.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_174);
    break;
  case UF_FOUR:
    local_178 = 4.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_178);
    break;
  case UF_FIVE:
    local_17c = 5.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_17c);
    break;
  case UF_SIX:
    local_180 = 6.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_180);
    break;
  case UF_SEVEN:
    local_184 = 7.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_184);
    break;
  case UF_EIGHT:
    local_188 = 8.0;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_188);
    break;
  case UF_HALF:
    local_18c = 0.5;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_18c);
    break;
  case UF_THIRD:
    local_190 = 0.33333334;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_190);
    break;
  case UF_FOURTH:
    local_194 = 0.25;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_194);
    break;
  case UF_FIFTH:
    local_198 = 0.2;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_198);
    break;
  case UF_SIXTH:
    local_19c = 0.16666667;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_19c);
    break;
  case UF_SEVENTH:
    local_1a0 = 0.14285715;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1a0);
    break;
  case UF_EIGHTH:
    local_1a4 = 0.125;
    addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1a4);
    break;
  case UV2_MINUS_ONE:
    tcu::Vector<float,_2>::Vector(&local_1ac,-1.0);
    addUniform<tcu::Vector<float,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1ac);
    break;
  case UV2_ZERO:
    tcu::Vector<float,_2>::Vector(&local_1b4,0.0);
    addUniform<tcu::Vector<float,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1b4);
    break;
  case UV2_ONE:
    tcu::Vector<float,_2>::Vector(&local_1bc,1.0);
    addUniform<tcu::Vector<float,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1bc);
    break;
  case UV2_TWO:
    tcu::Vector<float,_2>::Vector(&local_1c4,2.0);
    addUniform<tcu::Vector<float,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1c4);
    break;
  case UV2_THREE:
    tcu::Vector<float,_2>::Vector(&local_1cc,3.0);
    addUniform<tcu::Vector<float,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1cc);
    break;
  case UV2_HALF:
    tcu::Vector<float,_2>::Vector(&local_1d4,0.5);
    addUniform<tcu::Vector<float,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1d4);
    break;
  case UV3_MINUS_ONE:
    tcu::Vector<float,_3>::Vector(&local_1e0,-1.0);
    addUniform<tcu::Vector<float,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1e0);
    break;
  case UV3_ZERO:
    tcu::Vector<float,_3>::Vector(&local_1ec,0.0);
    addUniform<tcu::Vector<float,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1ec);
    break;
  case UV3_ONE:
    tcu::Vector<float,_3>::Vector(&local_1f8,1.0);
    addUniform<tcu::Vector<float,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_1f8);
    break;
  case UV3_TWO:
    tcu::Vector<float,_3>::Vector(&local_204,2.0);
    addUniform<tcu::Vector<float,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_204);
    break;
  case UV3_THREE:
    tcu::Vector<float,_3>::Vector(&local_210,3.0);
    addUniform<tcu::Vector<float,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_210);
    break;
  case UV3_HALF:
    tcu::Vector<float,_3>::Vector(&local_21c,0.5);
    addUniform<tcu::Vector<float,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_21c);
    break;
  case UV4_MINUS_ONE:
    tcu::Vector<float,_4>::Vector(&local_22c,-1.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_22c);
    break;
  case UV4_ZERO:
    tcu::Vector<float,_4>::Vector(&local_23c,0.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_23c);
    break;
  case UV4_ONE:
    tcu::Vector<float,_4>::Vector(&local_24c,1.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_24c);
    break;
  case UV4_TWO:
    tcu::Vector<float,_4>::Vector(&local_25c,2.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_25c);
    break;
  case UV4_THREE:
    tcu::Vector<float,_4>::Vector(&local_26c,3.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_26c);
    break;
  case UV4_HALF:
    tcu::Vector<float,_4>::Vector(&local_27c,0.5);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_27c);
    break;
  case UV4_BLACK:
    tcu::Vector<float,_4>::Vector(&local_28c,0.0,0.0,0.0,1.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_28c);
    break;
  case UV4_GRAY:
    tcu::Vector<float,_4>::Vector(&local_29c,0.5,0.5,0.5,1.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_29c);
    break;
  case UV4_WHITE:
    tcu::Vector<float,_4>::Vector(&local_2ac,1.0,1.0,1.0,1.0);
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_2ac);
    break;
  default:
    this_00 = Context::getTestContext((this->super_TestInstance).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_430,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_430,(char (*) [23])"Unknown Uniform type: ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(BaseUniformType *)(local_20 + 2));
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_430);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::useUniform (deUint32 bindingLocation, BaseUniformType type)
{
	#define UNIFORM_CASE(type, value) case type: addUniform(bindingLocation, VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, value); break

	switch(type)
	{
		// Bool
		UNIFORM_CASE(UB_FALSE,	0);
		UNIFORM_CASE(UB_TRUE,	1);

		// BVec4
		UNIFORM_CASE(UB4_FALSE,	tcu::Vec4(0));
		UNIFORM_CASE(UB4_TRUE,	tcu::Vec4(1));

		// Integer
		UNIFORM_CASE(UI_ZERO,	0);
		UNIFORM_CASE(UI_ONE,	1);
		UNIFORM_CASE(UI_TWO,	2);
		UNIFORM_CASE(UI_THREE,	3);
		UNIFORM_CASE(UI_FOUR,	4);
		UNIFORM_CASE(UI_FIVE,	5);
		UNIFORM_CASE(UI_SIX,	6);
		UNIFORM_CASE(UI_SEVEN,	7);
		UNIFORM_CASE(UI_EIGHT,	8);
		UNIFORM_CASE(UI_ONEHUNDREDONE, 101);

		// IVec2
		UNIFORM_CASE(UI2_MINUS_ONE,	tcu::IVec2(-1));
		UNIFORM_CASE(UI2_ZERO,		tcu::IVec2(0));
		UNIFORM_CASE(UI2_ONE,		tcu::IVec2(1));
		UNIFORM_CASE(UI2_TWO,		tcu::IVec2(2));
		UNIFORM_CASE(UI2_THREE,		tcu::IVec2(3));
		UNIFORM_CASE(UI2_FOUR,		tcu::IVec2(4));
		UNIFORM_CASE(UI2_FIVE,		tcu::IVec2(5));

		// IVec3
		UNIFORM_CASE(UI3_MINUS_ONE,	tcu::IVec3(-1));
		UNIFORM_CASE(UI3_ZERO,		tcu::IVec3(0));
		UNIFORM_CASE(UI3_ONE,		tcu::IVec3(1));
		UNIFORM_CASE(UI3_TWO,		tcu::IVec3(2));
		UNIFORM_CASE(UI3_THREE,		tcu::IVec3(3));
		UNIFORM_CASE(UI3_FOUR,		tcu::IVec3(4));
		UNIFORM_CASE(UI3_FIVE,		tcu::IVec3(5));

		// IVec4
		UNIFORM_CASE(UI4_MINUS_ONE, tcu::IVec4(-1));
		UNIFORM_CASE(UI4_ZERO,		tcu::IVec4(0));
		UNIFORM_CASE(UI4_ONE,		tcu::IVec4(1));
		UNIFORM_CASE(UI4_TWO,		tcu::IVec4(2));
		UNIFORM_CASE(UI4_THREE,		tcu::IVec4(3));
		UNIFORM_CASE(UI4_FOUR,		tcu::IVec4(4));
		UNIFORM_CASE(UI4_FIVE,		tcu::IVec4(5));

		// Float
		UNIFORM_CASE(UF_ZERO,		0.0f);
		UNIFORM_CASE(UF_ONE,		1.0f);
		UNIFORM_CASE(UF_TWO,		2.0f);
		UNIFORM_CASE(UF_THREE,		3.0f);
		UNIFORM_CASE(UF_FOUR,		4.0f);
		UNIFORM_CASE(UF_FIVE,		5.0f);
		UNIFORM_CASE(UF_SIX,		6.0f);
		UNIFORM_CASE(UF_SEVEN,		7.0f);
		UNIFORM_CASE(UF_EIGHT,		8.0f);

		UNIFORM_CASE(UF_HALF,		1.0f / 2.0f);
		UNIFORM_CASE(UF_THIRD,		1.0f / 3.0f);
		UNIFORM_CASE(UF_FOURTH,		1.0f / 4.0f);
		UNIFORM_CASE(UF_FIFTH,		1.0f / 5.0f);
		UNIFORM_CASE(UF_SIXTH,		1.0f / 6.0f);
		UNIFORM_CASE(UF_SEVENTH,	1.0f / 7.0f);
		UNIFORM_CASE(UF_EIGHTH,		1.0f / 8.0f);

		// Vec2
		UNIFORM_CASE(UV2_MINUS_ONE,	tcu::Vec2(-1.0f));
		UNIFORM_CASE(UV2_ZERO,		tcu::Vec2(0.0f));
		UNIFORM_CASE(UV2_ONE,		tcu::Vec2(1.0f));
		UNIFORM_CASE(UV2_TWO,		tcu::Vec2(2.0f));
		UNIFORM_CASE(UV2_THREE,		tcu::Vec2(3.0f));

		UNIFORM_CASE(UV2_HALF,		tcu::Vec2(1.0f / 2.0f));

		// Vec3
		UNIFORM_CASE(UV3_MINUS_ONE,	tcu::Vec3(-1.0f));
		UNIFORM_CASE(UV3_ZERO,		tcu::Vec3(0.0f));
		UNIFORM_CASE(UV3_ONE,		tcu::Vec3(1.0f));
		UNIFORM_CASE(UV3_TWO,		tcu::Vec3(2.0f));
		UNIFORM_CASE(UV3_THREE,		tcu::Vec3(3.0f));

		UNIFORM_CASE(UV3_HALF,		tcu::Vec3(1.0f / 2.0f));

		// Vec4
		UNIFORM_CASE(UV4_MINUS_ONE,	tcu::Vec4(-1.0f));
		UNIFORM_CASE(UV4_ZERO,		tcu::Vec4(0.0f));
		UNIFORM_CASE(UV4_ONE,		tcu::Vec4(1.0f));
		UNIFORM_CASE(UV4_TWO,		tcu::Vec4(2.0f));
		UNIFORM_CASE(UV4_THREE,		tcu::Vec4(3.0f));

		UNIFORM_CASE(UV4_HALF,		tcu::Vec4(1.0f / 2.0f));

		UNIFORM_CASE(UV4_BLACK,		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		UNIFORM_CASE(UV4_GRAY,		tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));
		UNIFORM_CASE(UV4_WHITE,		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

		default:
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Unknown Uniform type: " << type << tcu::TestLog::EndMessage;
			break;
	}

	#undef UNIFORM_CASE
}